

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio_utils.hpp
# Opt level: O0

void setsc<double>(string *entry,double *output)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long *plVar3;
  FILEIO_Exception *this;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  double *output_local;
  string *entry_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)entry,_Var2);
  plVar3 = (long *)std::istream::operator>>((istream *)local_1a0,output);
  bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::~stringstream(local_1a0);
    return;
  }
  this = (FILEIO_Exception *)__cxa_allocate_exception(0x28);
  std::operator+(&local_230,"Error parsing string \'",entry);
  std::operator+(&local_210,&local_230,"\' into type \'");
  __rhs = std::type_info::name((type_info *)&double::typeinfo);
  std::operator+(&local_1f0,&local_210,__rhs);
  std::operator+(&local_1d0,&local_1f0,"\'");
  FILEIO_Exception::FILEIO_Exception(this,&local_1d0);
  __cxa_throw(this,&FILEIO_Exception::typeinfo,FILEIO_Exception::~FILEIO_Exception);
}

Assistant:

void setsc(const string& entry, T& output) {
  stringstream ss(entry);
  if(!(ss >> output)) {
    throw(FILEIO_Exception("Error parsing string '" + entry + "' into type '" + typeid(T).name() + "'"));
  }
}